

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::Node
          (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this,
          TestCaseStats *_value)

{
  TestCaseStats *_value_local;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this_local;
  
  SharedImpl<Catch::IShared>::SharedImpl(&this->super_SharedImpl<Catch::IShared>);
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_00247870;
  TestCaseStats::TestCaseStats(&this->value,_value);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::vector(&this->children);
  return;
}

Assistant:

explicit Node( T const& _value ) : value( _value ) {}